

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR mergeforward(LispPTR base)

{
  ushort uVar1;
  LispPTR *pLVar2;
  LispPTR LVar3;
  LispPTR LAddr;
  
  LVar3 = 0;
  if ((base != 0) && (*ArrayMerging_word != 0)) {
    checkarrayblock(base,1,1);
    pLVar2 = NativeAligned4FromLAddr(base);
    LAddr = base + (uint)(ushort)*pLVar2 * 2;
    if ((LAddr != *ArrayFrLst_word) && (LVar3 = 0, LAddr != *ArrayFrLst2_word)) {
      pLVar2 = NativeAligned4FromLAddr(LAddr);
      uVar1 = *(ushort *)((long)pLVar2 + 2);
      checkarrayblock(LAddr,uVar1 & 1 ^ 1,0);
      LVar3 = 0;
      if ((uVar1 & 1) == 0) {
        deleteblock(LAddr);
        deleteblock(base);
        arrayblockmerger(base,LAddr);
        LVar3 = base;
      }
    }
  }
  return LVar3;
}

Assistant:

LispPTR mergeforward(LispPTR base) {
  LispPTR nbase, nbinuse;
  struct arrayblock *bbase, *bnbase;
  if (*ArrayMerging_word == NIL) return NIL;
  if (base == NIL) return NIL;
  if (checkarrayblock(base, T, T)) return NIL;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  nbase = base + 2 * (bbase->arlen);
  if (nbase == *ArrayFrLst_word || nbase == *ArrayFrLst2_word) return NIL;

  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  nbinuse = bnbase->inuse;
  if (checkarrayblock(nbase, !nbinuse, NIL)) return NIL;
  if (nbinuse) return (NIL);
  deleteblock(nbase);
  deleteblock(base);
  return (arrayblockmerger(base, nbase));
}